

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
::findIdx<Rml::Element*>
          (Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
           *this,Element **key)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  long *plVar4;
  InfoType info;
  size_t idx;
  InfoType local_34;
  size_t local_30;
  
  local_30 = 0;
  local_34 = 0;
  keyToIdx<Rml::Element*const&>(this,key,&local_30,&local_34);
  lVar1 = *(long *)(this + 8);
  uVar2 = (uint)*(byte *)(lVar1 + local_30);
  plVar4 = (long *)(local_30 * 0x20 + *(long *)this + 0x20);
  while( true ) {
    if ((local_34 == uVar2) && (*key == (Element *)plVar4[-4])) {
      return local_30;
    }
    if ((*(int *)(this + 0x28) + local_34 == (uint)*(byte *)(lVar1 + 1 + local_30)) &&
       (*key == (Element *)*plVar4)) break;
    local_34 = local_34 + *(int *)(this + 0x28) * 2;
    uVar2 = (uint)*(byte *)(lVar1 + 2 + local_30);
    plVar4 = plVar4 + 8;
    local_30 = local_30 + 2;
    if (uVar2 < local_34) {
      if (*(long *)(this + 0x18) == 0) {
        sVar3 = 0;
      }
      else {
        sVar3 = lVar1 - *(long *)this >> 5;
      }
      return sVar3;
    }
  }
  return local_30 + 1;
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }